

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxu8 randomByte(SyPRNGCtx *pCtx)

{
  uchar uVar1;
  sxu8 t;
  SyPRNGCtx *pCtx_local;
  
  pCtx->i = pCtx->i + '\x01';
  uVar1 = pCtx->s[pCtx->i];
  pCtx->j = pCtx->j + uVar1;
  pCtx->s[pCtx->i] = pCtx->s[pCtx->j];
  pCtx->s[pCtx->j] = uVar1;
  return pCtx->s[(byte)(uVar1 + pCtx->s[pCtx->i])];
}

Assistant:

static sxu8 randomByte(SyPRNGCtx *pCtx)
{
  sxu8 t;
  
  /* Generate and return single random byte */
  pCtx->i++;
  t = pCtx->s[pCtx->i];
  pCtx->j += t;
  pCtx->s[pCtx->i] = pCtx->s[pCtx->j];
  pCtx->s[pCtx->j] = t;
  t += pCtx->s[pCtx->i];
  return pCtx->s[t];
}